

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdapStrategy.cpp
# Opt level: O0

void __thiscall
Vault::LdapStrategy::LdapStrategy(LdapStrategy *this,string *username,string *password)

{
  string *password_local;
  string *username_local;
  LdapStrategy *this_local;
  
  AuthenticationStrategy::AuthenticationStrategy(&this->super_AuthenticationStrategy);
  (this->super_AuthenticationStrategy)._vptr_AuthenticationStrategy =
       (_func_int **)&PTR__LdapStrategy_0026d6b0;
  std::__cxx11::string::string((string *)&this->username_,(string *)username);
  std::__cxx11::string::string((string *)&this->password_,(string *)password);
  return;
}

Assistant:

Vault::LdapStrategy::LdapStrategy(std::string username, std::string password)
    : username_(std::move(username)), password_(std::move(password)) {}